

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

long dlib::
     matrix_unroll_helper<dlib::assignable_row_matrix<double,_3L,_3L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>,_true>,_1L,_3L,_0L,_2L,_false>
     ::go(void)

{
  long lVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  
  lVar1 = *in_RDI;
  *(double *)(lVar1 + 0x10 + in_RDI[1] * 0x18) =
       *(double *)(*(long *)*in_RSI + 0x10) * (double)in_RSI[1];
  return lVar1;
}

Assistant:

const type operator() (
            long r, 
            long c
        ) const { return m(r,c)*s; }